

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void insert_rnd_value_of<A,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
               (vec_collection *v,
               mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
               *gen,uniform_real_distribution<double> *rnd)

{
  _Head_base<0UL,_A_*,_false> local_20;
  result_type_conflict2 local_18;
  
  local_18 = std::uniform_real_distribution<double>::operator()(rnd,gen);
  std::make_unique<A,double>((double *)&local_20);
  std::
  vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
  ::emplace_back<std::unique_ptr<A,std::default_delete<A>>>
            ((vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
              *)v,(unique_ptr<A,_std::default_delete<A>_> *)&local_20);
  if (local_20._M_head_impl != (A *)0x0) {
    (*(local_20._M_head_impl)->_vptr_A[1])();
  }
  return;
}

Assistant:

void insert_rnd_value_of( vec_collection& v, E& gen, R& rnd)
{
	v.push_back(std::make_unique<T>( rnd(gen) ));
}